

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O2

u16string * __thiscall
TextBuffer::Layer::text_in_range_abi_cxx11_
          (u16string *__return_storage_ptr__,Layer *this,Range range,bool splay)

{
  ClipResult CVar1;
  ClipResult CVar2;
  anon_class_8_1_6971b95b local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  CVar1 = clip_position(this,range.start,false);
  CVar2 = clip_position(this,range.end,false);
  local_30.result = __return_storage_ptr__;
  for_each_chunk_in_range<TextBuffer::Layer::text_in_range[abi:cxx11](Range,bool)::_lambda(TextSlice)_1_>
            (this,CVar1.position,CVar2.position,&local_30,splay);
  return __return_storage_ptr__;
}

Assistant:

u16string text_in_range(Range range, bool splay = false) {
    u16string result;
    for_each_chunk_in_range(
      clip_position(range.start).position,
      clip_position(range.end).position,
      [&result](TextSlice slice) {
        result.insert(result.end(), slice.begin(), slice.end());
        return false;
      },
      splay
    );
    return result;
  }